

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksort.c
# Opt level: O2

void BZ2_blockSort(EState *s)

{
  int *piVar1;
  byte bVar2;
  uint nblock;
  UInt32 UVar3;
  UInt32 *pUVar4;
  byte *block;
  bool bVar5;
  Bool BVar6;
  Int32 yyn_1;
  uint uVar7;
  uint uVar8;
  int iVar9;
  UInt32 UVar10;
  uint *puVar11;
  ulong uVar12;
  byte bVar13;
  int iVar14;
  Int32 *pIVar15;
  char cVar16;
  byte bVar17;
  uint uVar18;
  int iVar19;
  byte *pbVar20;
  long lVar21;
  ulong uVar22;
  uint uVar23;
  long lVar24;
  byte *pbVar25;
  ushort uVar26;
  long lVar27;
  byte bVar28;
  UInt16 UVar29;
  int iVar30;
  UInt32 *pUVar31;
  uint in_R8D;
  Int32 yyn;
  uint uVar32;
  uint uVar33;
  byte *pbVar34;
  int iVar35;
  uint uVar36;
  uint uVar37;
  long lVar38;
  int iVar39;
  UInt32 *bhtab;
  Int32 zztmp;
  int iVar40;
  int local_12bc;
  Int32 budget;
  ulong local_1290;
  byte *local_1288;
  UInt16 *local_1280;
  ulong local_1278;
  long local_1270;
  ulong local_1268;
  ulong local_1260;
  ulong local_1258;
  long local_1250;
  long local_1248;
  ulong local_1240;
  UInt32 *local_1238;
  long local_1230;
  long local_1228;
  uint local_121c;
  int local_1218;
  int local_1214;
  int local_1210;
  int local_120c;
  EState *local_1208;
  ulong local_1200;
  UInt32 *local_11f8;
  ulong local_11f0;
  Bool bigDone [256];
  int local_10e8 [100];
  Int32 stackHi [100];
  Int32 stackLo [100];
  Int32 runningOrder [256];
  uint auStack_838 [256];
  Int32 copyStart [256];
  
  bhtab = s->ftab;
  pUVar4 = s->ptr;
  nblock = s->nblock;
  pbVar20 = (byte *)(ulong)nblock;
  if (9999 < (int)nblock) {
    block = s->block;
    iVar14 = s->workFactor;
    uVar22 = (ulong)((nblock & 1) + nblock + 0x22);
    if (iVar14 < 2) {
      iVar14 = 1;
    }
    cVar16 = 'd';
    if (iVar14 < 100) {
      cVar16 = (char)iVar14;
    }
    budget = ((byte)(cVar16 - 1U) / 3) * nblock;
    local_1290 = CONCAT44(local_1290._4_4_,budget);
    for (uVar7 = 0x10000; -1 < (int)uVar7; uVar7 = uVar7 - 1) {
      bhtab[uVar7] = 0;
    }
    local_1280 = (UInt16 *)(block + uVar22);
    uVar12 = (ulong)*block << 8;
    local_121c = nblock - 1;
    uVar7 = nblock;
    while( true ) {
      uVar8 = uVar7 - 4;
      uVar18 = uVar7 - 1;
      if ((int)uVar18 < 3) break;
      local_1280[uVar18] = 0;
      bVar13 = block[uVar18];
      bhtab[(uint)bVar13 << 8 | (uint)(uVar12 >> 8)] =
           bhtab[(uint)bVar13 << 8 | (uint)(uVar12 >> 8)] + 1;
      local_1280[uVar7 - 2] = 0;
      bVar28 = block[uVar7 - 2];
      bhtab[CONCAT11(bVar28,bVar13)] = bhtab[CONCAT11(bVar28,bVar13)] + 1;
      local_1280[uVar7 - 3] = 0;
      bVar13 = block[uVar7 - 3];
      piVar1 = (int *)((long)bhtab + (ulong)((uint)bVar13 * 0x400 + (uint)bVar28 * 4));
      *piVar1 = *piVar1 + 1;
      local_1280[uVar8] = 0;
      uVar12 = (ulong)CONCAT11(block[uVar8],bVar13);
      bhtab[uVar12] = bhtab[uVar12] + 1;
      uVar7 = uVar8;
    }
    for (; -1 < (int)uVar18; uVar18 = uVar18 - 1) {
      local_1280[uVar18] = 0;
      uVar7 = (uint)block[uVar18] << 8 | (uint)(uVar12 >> 8);
      bhtab[uVar7] = bhtab[uVar7] + 1;
      uVar12 = (ulong)uVar7;
    }
    for (lVar21 = 0; lVar21 != 0x22; lVar21 = lVar21 + 1) {
      (block + (long)pbVar20)[lVar21] = block[lVar21];
      (block + lVar21 * 2 + uVar22 + (long)pbVar20 * 2)[0] = 0;
      (block + lVar21 * 2 + uVar22 + (long)pbVar20 * 2)[1] = 0;
    }
    for (lVar21 = 0; lVar21 != 0x10000; lVar21 = lVar21 + 1) {
      bhtab[lVar21 + 1] = bhtab[lVar21 + 1] + bhtab[lVar21];
    }
    uVar26 = (ushort)*block << 8;
    uVar7 = nblock;
    while( true ) {
      uVar8 = uVar7 - 4;
      uVar18 = uVar7 - 1;
      if ((int)uVar18 < 3) break;
      bVar13 = block[uVar18];
      uVar26 = (ushort)bVar13 << 8 | uVar26 >> 8;
      UVar10 = bhtab[uVar26];
      bhtab[uVar26] = UVar10 - 1;
      pUVar4[(int)(UVar10 - 1)] = uVar18;
      bVar28 = block[uVar7 - 2];
      uVar26 = CONCAT11(bVar28,bVar13);
      UVar10 = bhtab[uVar26];
      bhtab[uVar26] = UVar10 - 1;
      pUVar4[(int)(UVar10 - 1)] = uVar7 - 2;
      bVar13 = block[uVar7 - 3];
      uVar26 = CONCAT11(bVar13,bVar28);
      UVar10 = bhtab[uVar26];
      bhtab[uVar26] = UVar10 - 1;
      pUVar4[(int)(UVar10 - 1)] = uVar7 - 3;
      uVar26 = CONCAT11(block[uVar8],bVar13);
      UVar10 = bhtab[uVar26];
      bhtab[uVar26] = UVar10 - 1;
      pUVar4[(int)(UVar10 - 1)] = uVar8;
      uVar7 = uVar8;
    }
    for (; -1 < (int)uVar18; uVar18 = uVar18 - 1) {
      uVar26 = uVar26 >> 8 | (ushort)block[uVar18] << 8;
      UVar10 = bhtab[uVar26];
      bhtab[uVar26] = UVar10 - 1;
      pUVar4[(int)(UVar10 - 1)] = uVar18;
    }
    for (lVar21 = 0; lVar21 != 0x100; lVar21 = lVar21 + 1) {
      bigDone[lVar21] = '\0';
      runningOrder[lVar21] = (Int32)lVar21;
    }
    pbVar34 = block;
    iVar14 = 0x16c;
    do {
      iVar9 = iVar14 / 3;
      iVar30 = 0;
      for (lVar21 = (long)iVar9; lVar21 < 0x100; lVar21 = lVar21 + 1) {
        uVar7 = runningOrder[lVar21];
        pbVar34 = (byte *)(ulong)uVar7;
        UVar10 = bhtab[(int)(uVar7 * 0x100 + 0x100)];
        UVar3 = bhtab[(int)(uVar7 * 0x100)];
        iVar39 = iVar30;
        do {
          iVar40 = runningOrder[iVar39] * 0x100;
          lVar27 = (long)(iVar9 + iVar39);
          if (bhtab[iVar40 + 0x100] - bhtab[iVar40] <= UVar10 - UVar3) break;
          runningOrder[iVar9 + iVar39] = runningOrder[iVar39];
          bVar5 = iVar9 <= iVar39;
          lVar27 = (long)iVar39;
          iVar39 = iVar39 - iVar9;
        } while (bVar5);
        runningOrder[lVar27] = uVar7;
        iVar30 = iVar30 + 1;
      }
      uVar7 = iVar14 - 3;
      iVar14 = iVar9;
    } while (2 < uVar7);
    local_11f8 = bhtab + 1;
    lVar21 = 0;
    local_1238 = bhtab;
    local_1208 = s;
    while (in_R8D = (uint)pbVar34, lVar21 != 0x100) {
      uVar22 = (ulong)(uint)runningOrder[lVar21];
      local_1218 = runningOrder[lVar21] << 8;
      local_1240 = (ulong)local_1218;
      local_1248 = lVar21;
      local_11f0 = uVar22;
      for (uVar12 = 0; uVar12 != 0x100; uVar12 = uVar12 + 1) {
        if (uVar12 != uVar22) {
          local_1200 = uVar12 | local_1240;
          uVar7 = bhtab[local_1200];
          if (((uVar7 >> 0x15 & 1) == 0) &&
             (iVar14 = (bhtab[local_1200 + 1] & 0xffdfffff) - 1, (int)uVar7 < iVar14)) {
            stackLo[0] = uVar7;
            stackHi[0] = iVar14;
            local_10e8[0] = 2;
            local_1258 = 1;
            local_1268 = uVar12;
LAB_006139ca:
            uVar22 = local_1258 & 0xffffffff;
LAB_006139d6:
            in_R8D = (uint)pbVar34;
            if (0 < (int)uVar22) {
              local_1258 = (ulong)((int)uVar22 - 1);
              local_1260 = uVar22;
LAB_006139f3:
              if (0x61 < (uint)local_1260) {
                bz_internal_error(0x3e9);
              }
              uVar7 = stackLo[local_1258];
              local_1278 = (ulong)uVar7;
              uVar18 = stackHi[local_1258];
              pbVar34 = (byte *)(ulong)uVar18;
              lVar21 = (long)(int)uVar18;
              iVar14 = local_10e8[local_1258];
              iVar9 = uVar18 - uVar7;
              uVar12 = local_1268;
              if ((0x13 < iVar9) && (iVar14 < 0xf)) {
                local_1250 = (long)(int)uVar7;
                bVar13 = block[pUVar4[local_1250] + iVar14];
                bVar28 = block[pUVar4[lVar21] + iVar14];
                bVar17 = bVar28;
                if (bVar13 >= bVar28 && bVar13 != bVar28) {
                  bVar17 = bVar13;
                }
                bVar2 = block[pUVar4[(int)(uVar18 + uVar7) >> 1] + iVar14];
                if (bVar13 < bVar28) {
                  bVar28 = bVar13;
                }
                if (bVar28 <= bVar2) {
                  bVar28 = bVar2;
                }
                uVar22 = local_1278;
                uVar8 = uVar18;
                uVar36 = uVar18;
                uVar32 = uVar7;
                if (bVar17 <= bVar2) {
                  bVar28 = bVar17;
                }
LAB_00613aa3:
                lVar21 = (long)(int)uVar36 + 1;
                local_12bc = (int)uVar22;
                uVar22 = (ulong)local_12bc;
                local_1270 = CONCAT44(local_1270._4_4_,local_12bc - uVar7);
                local_12bc = -local_12bc;
LAB_00613abd:
                lVar24 = (long)(int)uVar32;
                lVar27 = lVar24;
                do {
                  uVar32 = uVar32 + 1;
                  if ((int)uVar36 < lVar27) {
                    lVar27 = lVar24;
                    if (lVar24 < lVar21) {
                      lVar27 = lVar21;
                    }
LAB_00613b11:
                    iVar30 = (int)lVar27;
                    lVar21 = (long)iVar30;
                    lVar27 = (long)(int)uVar8;
                    iVar9 = uVar18 - uVar8;
                    goto LAB_00613b21;
                  }
                  UVar10 = pUVar4[lVar27];
                  bVar13 = block[UVar10 + iVar14];
                  if (bVar13 == bVar28) goto LAB_00613aeb;
                  if (bVar28 <= bVar13 && bVar13 != bVar28) goto LAB_00613b11;
                  lVar27 = lVar27 + 1;
                } while( true );
              }
              if (iVar9 < 1) goto LAB_00614025;
              lVar27 = -1;
              pIVar15 = incs;
              do {
                lVar27 = lVar27 + 1;
                iVar30 = *pIVar15;
                pIVar15 = pIVar15 + 1;
              } while (iVar30 <= iVar9);
              local_1210 = uVar7 + 1;
              local_1214 = uVar7 + 2;
              uVar22 = local_1278;
              local_1228 = lVar21;
              do {
                if (lVar27 < 1) {
                  local_1290 = CONCAT44(local_1290._4_4_,budget);
                  goto LAB_00614025;
                }
                iVar9 = *(int *)(&DAT_006ca9cc + lVar27 * 4);
                local_1230 = lVar27 + -1;
                iVar30 = (int)uVar22 + iVar9;
                local_1288 = (byte *)CONCAT44(local_1288._4_4_,iVar30);
                lVar24 = (long)iVar30;
                local_1260 = CONCAT44(local_1260._4_4_,local_1214);
                local_1250 = CONCAT44(local_1250._4_4_,local_1210);
                pbVar25 = (byte *)(uVar22 & 0xffffffff);
                while (lVar27 = local_1230, pbVar34 = pbVar25, lVar24 <= lVar21) {
                  uVar7 = pUVar4[lVar24];
                  local_1290 = (ulong)uVar7;
                  local_120c = (int)pbVar25;
                  local_1270 = lVar24;
                  do {
                    iVar30 = (int)pbVar25;
                    UVar10 = pUVar4[iVar30];
                    pbVar34 = pbVar20;
                    BVar6 = mainGtU(UVar10 + iVar14,uVar7 + iVar14,block,local_1280,nblock,&budget);
                    lVar21 = (long)(iVar9 + iVar30);
                    if (BVar6 == '\0') break;
                    pUVar4[iVar9 + iVar30] = UVar10;
                    pbVar25 = (byte *)(ulong)(uint)(iVar30 - iVar9);
                    lVar21 = (long)iVar30;
                  } while ((int)local_1288 <= iVar30);
                  pUVar4[lVar21] = (UInt32)local_1290;
                  uVar22 = local_1278;
                  lVar27 = local_1230;
                  uVar12 = local_1268;
                  lVar21 = local_1228;
                  bhtab = local_1238;
                  if (local_1228 <= local_1270) break;
                  uVar7 = pUVar4[local_1270 + 1];
                  local_1290 = (ulong)uVar7;
                  iVar30 = (int)local_1250;
                  do {
                    UVar10 = pUVar4[iVar30];
                    pbVar34 = pbVar20;
                    BVar6 = mainGtU(UVar10 + iVar14,uVar7 + iVar14,block,local_1280,nblock,&budget);
                    lVar21 = (long)(iVar9 + iVar30);
                    if (BVar6 == '\0') break;
                    pUVar4[iVar9 + iVar30] = UVar10;
                    bVar5 = (int)local_1288 <= iVar30;
                    lVar21 = (long)iVar30;
                    iVar30 = iVar30 - iVar9;
                  } while (bVar5);
                  pUVar4[lVar21] = (UInt32)local_1290;
                  uVar22 = local_1278;
                  lVar27 = local_1230;
                  uVar12 = local_1268;
                  lVar21 = local_1228;
                  bhtab = local_1238;
                  if (local_1228 < local_1270 + 2) break;
                  uVar7 = pUVar4[local_1270 + 2];
                  local_1290 = (ulong)uVar7;
                  iVar30 = (int)local_1260;
                  do {
                    UVar10 = pUVar4[iVar30];
                    BVar6 = mainGtU(UVar10 + iVar14,uVar7 + iVar14,block,local_1280,nblock,&budget);
                    lVar21 = (long)(iVar9 + iVar30);
                    if (BVar6 == '\0') break;
                    pUVar4[iVar9 + iVar30] = UVar10;
                    bVar5 = (int)local_1288 <= iVar30;
                    lVar21 = (long)iVar30;
                    iVar30 = iVar30 - iVar9;
                  } while (bVar5);
                  pUVar4[lVar21] = (UInt32)local_1290;
                  lVar24 = local_1270 + 3;
                  in_R8D = local_120c + 3;
                  pbVar25 = (byte *)(ulong)in_R8D;
                  local_1250 = CONCAT44(local_1250._4_4_,(int)local_1250 + 3);
                  local_1260 = CONCAT44(local_1260._4_4_,(int)local_1260 + 3);
                  uVar22 = local_1278;
                  uVar12 = local_1268;
                  lVar21 = local_1228;
                  s = local_1208;
                  bhtab = local_1238;
                  if (budget < 0) goto LAB_006142b7;
                }
              } while( true );
            }
            s = local_1208;
            if ((int)local_1290 < 0) goto LAB_006142b7;
            uVar7 = bhtab[local_1200];
          }
          bhtab[local_1200] = uVar7 | 0x200000;
          uVar22 = local_11f0;
        }
      }
      lVar21 = (long)(int)uVar22;
      if (bigDone[lVar21] != '\0') {
        bz_internal_error(0x3ee);
      }
      puVar11 = local_11f8 + lVar21;
      for (lVar27 = 0; lVar27 != 0x100; lVar27 = lVar27 + 1) {
        copyStart[lVar27] = puVar11[-1] & 0xffdfffff;
        auStack_838[lVar27] = (*puVar11 & 0xffdfffff) - 1;
        puVar11 = puVar11 + 0x100;
      }
      for (uVar22 = (long)(int)bhtab[local_1240] & 0xffffffffffdfffff; iVar14 = copyStart[lVar21],
          (long)uVar22 < (long)iVar14; uVar22 = uVar22 + 1) {
        UVar10 = (pUVar4[uVar22] + ((int)(pUVar4[uVar22] - 1) >> 0x1f & nblock)) - 1;
        bVar13 = block[(int)UVar10];
        if (bigDone[bVar13] == '\0') {
          iVar14 = copyStart[bVar13];
          copyStart[bVar13] = iVar14 + 1;
          pUVar4[iVar14] = UVar10;
        }
      }
      iVar9 = local_1218 + 0x100;
      uVar7 = bhtab[iVar9] & 0xffdfffff;
      while( true ) {
        uVar7 = uVar7 - 1;
        uVar18 = auStack_838[lVar21];
        if ((int)uVar7 <= (int)uVar18) break;
        UVar10 = (pUVar4[(int)uVar7] + ((int)(pUVar4[(int)uVar7] - 1) >> 0x1f & nblock)) - 1;
        bVar13 = block[(int)UVar10];
        if (bigDone[bVar13] == '\0') {
          uVar18 = auStack_838[bVar13];
          uVar8 = uVar18 - 1;
          pbVar34 = (byte *)(ulong)uVar8;
          auStack_838[bVar13] = uVar8;
          pUVar4[(int)uVar18] = UVar10;
        }
      }
      if ((iVar14 - 1U != uVar18) && ((iVar14 != 0 || (uVar18 != local_121c)))) {
        bz_internal_error(0x3ef);
      }
      for (lVar27 = 0; lVar27 != 0x40000; lVar27 = lVar27 + 0x400) {
        pbVar25 = (byte *)((long)bhtab + lVar27 + lVar21 * 4 + 2);
        *pbVar25 = *pbVar25 | 0x20;
      }
      bigDone[lVar21] = '\x01';
      if (local_1248 != 0xff) {
        UVar10 = bhtab[local_1240];
        iVar14 = (bhtab[iVar9] & 0xffdfffff) - (int)((long)(int)UVar10 & 0xffffffffffdfffffU);
        bVar13 = 0xff;
        do {
          bVar13 = bVar13 + 1;
        } while (0xfffe < iVar14 >> (bVar13 & 0x1f));
        iVar14 = iVar14 + -1;
        for (lVar21 = (long)iVar14; -1 < lVar21; lVar21 = lVar21 + -1) {
          UVar3 = pUVar4[((long)(int)UVar10 & 0xffffffffffdfffffU) + lVar21];
          pbVar34 = (byte *)(long)(int)UVar3;
          UVar29 = (UInt16)((uint)lVar21 >> (bVar13 & 0x1f));
          local_1280[(long)pbVar34] = UVar29;
          if ((long)pbVar34 < 0x22) {
            pbVar34 = (byte *)(long)(int)(UVar3 + nblock);
            local_1280[(long)pbVar34] = UVar29;
          }
        }
        if (0xffff < iVar14 >> (bVar13 & 0x1f)) {
          bz_internal_error(0x3ea);
        }
      }
      lVar21 = local_1248 + 1;
    }
    if (-1 < (int)local_1290) goto LAB_006142ca;
  }
LAB_006142b7:
  fallbackSort(s->arr1,s->arr2,bhtab,nblock,in_R8D);
LAB_006142ca:
  s->origPtr = -1;
  uVar12 = 0;
  uVar22 = (ulong)(uint)s->nblock;
  if (s->nblock < 1) {
    uVar22 = uVar12;
  }
  while( true ) {
    if (uVar22 == uVar12) {
      bz_internal_error(0x3eb);
      return;
    }
    if (pUVar4[uVar12] == 0) break;
    uVar12 = uVar12 + 1;
  }
  s->origPtr = (Int32)uVar12;
  return;
LAB_00613aeb:
  pUVar4[lVar27] = pUVar4[uVar22];
  pUVar4[uVar22] = UVar10;
  uVar22 = uVar22 + 1;
  local_1270 = CONCAT44(local_1270._4_4_,(int)local_1270 + 1);
  local_12bc = local_12bc + -1;
  goto LAB_00613abd;
LAB_00613b21:
  iVar39 = uVar8 - uVar36;
  uVar32 = -uVar36;
  lVar38 = (long)(int)uVar36;
  for (lVar24 = lVar38; uVar36 = (uint)lVar27, lVar21 <= lVar24; lVar24 = lVar24 + -1) {
    UVar10 = pUVar4[lVar24];
    if (block[UVar10 + iVar14] == bVar28) goto LAB_00613b62;
    if (block[UVar10 + iVar14] < bVar28) {
      UVar3 = pUVar4[lVar21];
      pUVar4[lVar21] = UVar10;
      pUVar4[lVar24] = UVar3;
      uVar8 = uVar36;
      uVar36 = ~uVar32;
      uVar32 = iVar30 + 1;
      goto LAB_00613aa3;
    }
    uVar32 = uVar32 + 1;
    iVar39 = iVar39 + 1;
  }
  if (lVar27 < (long)uVar22) {
    local_10e8[local_1258] = iVar14 + 1;
    local_1288 = pbVar34;
    goto LAB_006139f3;
  }
  iVar19 = (int)uVar22;
  iVar40 = iVar30 - iVar19;
  if ((int)(iVar19 - uVar7) < iVar30 - iVar19) {
    iVar40 = iVar19 - uVar7;
  }
  iVar35 = local_12bc + iVar30;
  if ((int)local_1270 < local_12bc + iVar30) {
    iVar35 = (int)local_1270;
  }
  pUVar31 = pUVar4;
  for (; 0 < iVar40; iVar40 = iVar40 + -1) {
    UVar10 = pUVar31[local_1250];
    pUVar31[local_1250] = pUVar31[iVar30 - iVar35];
    pUVar31[iVar30 - iVar35] = UVar10;
    pUVar31 = pUVar31 + 1;
  }
  if (lVar21 + -1 < lVar38) {
    lVar38 = lVar21 + -1;
  }
  iVar35 = uVar36 - (int)lVar38;
  iVar40 = uVar18 - uVar36;
  if (iVar35 <= (int)(uVar18 - uVar36)) {
    iVar40 = iVar35;
  }
  if (iVar9 < iVar39) {
    iVar39 = iVar9;
  }
  pUVar31 = pUVar4;
  for (; 0 < iVar40; iVar40 = iVar40 + -1) {
    UVar10 = pUVar31[iVar30];
    pUVar31[iVar30] = pUVar31[(long)(int)(uVar18 - iVar39) + 1];
    pUVar31[(long)(int)(uVar18 - iVar39) + 1] = UVar10;
    pUVar31 = pUVar31 + 1;
  }
  uVar37 = ((uVar7 - iVar19) + iVar30) - 1;
  local_1288 = (byte *)(ulong)uVar37;
  uVar32 = uVar18 - iVar35;
  uVar8 = uVar32 + 1;
  iVar9 = uVar18 - uVar8;
  uVar36 = uVar7;
  if ((int)(uVar37 - uVar7) < iVar9) {
    iVar9 = uVar37 - uVar7;
    uVar18 = uVar37;
    uVar36 = uVar8;
    uVar8 = uVar7;
    local_1288 = pbVar34;
  }
  uVar33 = (uVar7 - iVar19) + iVar30;
  uVar37 = uVar18;
  uVar7 = uVar8;
  iVar39 = iVar14 + 1;
  iVar30 = iVar14;
  if (iVar9 < (int)(uVar32 - uVar33)) {
    uVar37 = uVar32;
    iVar9 = uVar32 - uVar33;
    uVar7 = uVar33;
    uVar33 = uVar8;
    uVar32 = uVar18;
    iVar39 = iVar14;
    iVar30 = iVar14 + 1;
  }
  uVar23 = (uint)local_1288;
  uVar18 = uVar23;
  uVar8 = uVar36;
  iVar40 = iVar14;
  if ((int)(uVar23 - uVar36) < iVar9) {
    uVar18 = uVar37;
    uVar8 = uVar7;
    iVar40 = iVar30;
    uVar37 = uVar23;
    iVar30 = iVar14;
    uVar7 = uVar36;
  }
  pbVar34 = (byte *)(ulong)uVar7;
  stackLo[local_1258] = uVar8;
  stackHi[local_1258] = uVar18;
  local_10e8[local_1258] = iVar40;
  uVar22 = local_1260 & 0xffffffff;
  stackLo[uVar22] = uVar7;
  stackHi[uVar22] = uVar37;
  local_10e8[uVar22] = iVar30;
  stackLo[uVar22 + 1] = uVar33;
  stackHi[uVar22 + 1] = uVar32;
  stackHi[uVar22 - 99] = iVar39;
  uVar22 = (ulong)((int)local_1260 + 2);
  goto LAB_006139d6;
LAB_00613b62:
  pUVar4[lVar24] = pUVar4[lVar27];
  pUVar4[lVar27] = UVar10;
  lVar27 = lVar27 + -1;
  uVar36 = ~uVar32;
  iVar9 = iVar9 + 1;
  uVar8 = uVar8 - 1;
  goto LAB_00613b21;
LAB_00614025:
  in_R8D = (uint)pbVar34;
  s = local_1208;
  if ((int)local_1290 < 0) goto LAB_006142b7;
  goto LAB_006139ca;
}

Assistant:

void BZ2_blockSort ( EState* s )
{
   UInt32* ptr    = s->ptr; 
   UChar*  block  = s->block;
   UInt32* ftab   = s->ftab;
   Int32   nblock = s->nblock;
   Int32   verb   = s->verbosity;
   Int32   wfact  = s->workFactor;
   UInt16* quadrant;
   Int32   budget;
   Int32   budgetInit;
   Int32   i;

   if (nblock < 10000) {
      fallbackSort ( s->arr1, s->arr2, ftab, nblock, verb );
   } else {
      /* Calculate the location for quadrant, remembering to get
         the alignment right.  Assumes that &(block[0]) is at least
         2-byte aligned -- this should be ok since block is really
         the first section of arr2.
      */
      i = nblock+BZ_N_OVERSHOOT;
      if (i & 1) i++;
      quadrant = (UInt16*)(&(block[i]));

      /* (wfact-1) / 3 puts the default-factor-30
         transition point at very roughly the same place as 
         with v0.1 and v0.9.0.  
         Not that it particularly matters any more, since the
         resulting compressed stream is now the same regardless
         of whether or not we use the main sort or fallback sort.
      */
      if (wfact < 1  ) wfact = 1;
      if (wfact > 100) wfact = 100;
      budgetInit = nblock * ((wfact-1) / 3);
      budget = budgetInit;

      mainSort ( ptr, block, quadrant, ftab, nblock, verb, &budget );
      if (verb >= 3) 
         VPrintf3 ( "      %d work, %d block, ratio %5.2f\n",
                    budgetInit - budget,
                    nblock, 
                    (float)(budgetInit - budget) /
                    (float)(nblock==0 ? 1 : nblock) ); 
      if (budget < 0) {
         if (verb >= 2) 
            VPrintf0 ( "    too repetitive; using fallback"
                       " sorting algorithm\n" );
         fallbackSort ( s->arr1, s->arr2, ftab, nblock, verb );
      }
   }

   s->origPtr = -1;
   for (i = 0; i < s->nblock; i++)
      if (ptr[i] == 0)
         { s->origPtr = i; break; };

   AssertH( s->origPtr != -1, 1003 );
}